

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallScriptGenerator::GenerateScriptForConfig
          (cmInstallScriptGenerator *this,ostream *os,string *config,Indent indent)

{
  string local_50;
  Indent local_2c;
  string *local_28;
  string *config_local;
  ostream *os_local;
  cmInstallScriptGenerator *this_local;
  Indent indent_local;
  
  local_2c.Level = indent.Level;
  local_28 = config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  GetScript(&local_50,this,config);
  AddScriptInstallRule(this,os,local_2c,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  this->AddScriptInstallRule(os, indent, this->GetScript(config));
}